

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaLib.cpp
# Opt level: O1

char * xmrig::CudaLib::defaultLoader(void)

{
  return "libxmrig-cuda.so";
}

Assistant:

const char *xmrig::CudaLib::defaultLoader()
{
#   if defined(__APPLE__)
    return "/System/Library/Frameworks/OpenCL.framework/OpenCL"; // FIXME
#   elif defined(_WIN32)
    return "xmrig-cuda.dll";
#   else
    return "libxmrig-cuda.so";
#   endif
}